

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_state_fetch_resp(connectdata *conn,int imapcode,imapstate instate)

{
  CURLofft CVar1;
  bool bVar2;
  char *local_68;
  size_t chunk;
  char *endptr;
  curl_off_t size;
  char *pcStack_48;
  _Bool parsed;
  char *ptr;
  pingpong *pp;
  imap_conn *imapc;
  Curl_easy *data;
  imapstate local_20;
  CURLcode result;
  imapstate instate_local;
  int imapcode_local;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  imapc = (imap_conn *)conn->data;
  ptr = (char *)&conn->proto;
  pcStack_48 = (((Curl_easy *)imapc)->state).buffer;
  size._7_1_ = 0;
  endptr = (char *)0x0;
  pp = (pingpong *)ptr;
  local_20 = instate;
  result = imapcode;
  _instate_local = conn;
  if (imapcode != 0x2a) {
    Curl_pgrsSetDownloadSize((Curl_easy *)imapc,-1);
    state(_instate_local,IMAP_STOP);
    return CURLE_REMOTE_FILE_NOT_FOUND;
  }
  while( true ) {
    bVar2 = false;
    if (*pcStack_48 != '\0') {
      bVar2 = *pcStack_48 != '{';
    }
    if (!bVar2) break;
    pcStack_48 = pcStack_48 + 1;
  }
  if ((((*pcStack_48 == '{') &&
       (CVar1 = curlx_strtoofft(pcStack_48 + 1,(char **)&chunk,10,(curl_off_t *)&endptr),
       CVar1 == CURL_OFFT_OK)) && (1 < (long)(chunk - (long)pcStack_48))) &&
     (((*(char *)chunk == '}' && (*(char *)(chunk + 1) == '\r')) && (*(char *)(chunk + 2) == '\0')))
     ) {
    size._7_1_ = 1;
  }
  if ((size._7_1_ & 1) == 0) {
    Curl_failf((Curl_easy *)**(undefined8 **)(ptr + 0x58),"Failed to parse FETCH response.");
    data._4_4_ = CURLE_WEIRD_SERVER_REPLY;
  }
  else {
    Curl_infof((Curl_easy *)imapc,"Found %ld bytes to download\n",endptr);
    Curl_pgrsSetDownloadSize((Curl_easy *)imapc,(curl_off_t)endptr);
    if (*(long *)ptr != 0) {
      local_68 = *(char **)(ptr + 8);
      if (endptr < local_68) {
        local_68 = endptr;
      }
      if (local_68 == (char *)0x0) {
        state(_instate_local,IMAP_STOP);
        return CURLE_OK;
      }
      data._4_4_ = Curl_client_write(_instate_local,1,*(char **)ptr,(size_t)local_68);
      if (data._4_4_ != CURLE_OK) {
        return data._4_4_;
      }
      imapc[1].pp.sendthis = local_68 + (long)imapc[1].pp.sendthis;
      Curl_infof((Curl_easy *)imapc,"Written %zu bytes, %lu bytes are left for transfer\n",local_68,
                 (long)endptr - (long)local_68);
      if (local_68 < *(char **)(ptr + 8)) {
        memmove(*(void **)ptr,local_68 + *(long *)ptr,*(long *)(ptr + 8) - (long)local_68);
        *(long *)(ptr + 8) = *(long *)(ptr + 8) - (long)local_68;
      }
      else {
        (*Curl_cfree)(*(void **)ptr);
        ptr[0] = '\0';
        ptr[1] = '\0';
        ptr[2] = '\0';
        ptr[3] = '\0';
        ptr[4] = '\0';
        ptr[5] = '\0';
        ptr[6] = '\0';
        ptr[7] = '\0';
        ptr[8] = '\0';
        ptr[9] = '\0';
        ptr[10] = '\0';
        ptr[0xb] = '\0';
        ptr[0xc] = '\0';
        ptr[0xd] = '\0';
        ptr[0xe] = '\0';
        ptr[0xf] = '\0';
      }
    }
    if (imapc[1].pp.sendthis == endptr) {
      Curl_setup_transfer(_instate_local,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
    }
    else {
      imapc[1].pp.linestart_resp = endptr;
      Curl_setup_transfer(_instate_local,0,(curl_off_t)endptr,false,(curl_off_t *)0x0,-1,
                          (curl_off_t *)0x0);
    }
  }
  state(_instate_local,IMAP_STOP);
  return data._4_4_;
}

Assistant:

static CURLcode imap_state_fetch_resp(struct connectdata *conn, int imapcode,
                                      imapstate instate)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;
  const char *ptr = data->state.buffer;
  bool parsed = FALSE;
  curl_off_t size = 0;

  (void)instate; /* no use for this yet */

  if(imapcode != '*') {
    Curl_pgrsSetDownloadSize(data, -1);
    state(conn, IMAP_STOP);
    return CURLE_REMOTE_FILE_NOT_FOUND; /* TODO: Fix error code */
  }

  /* Something like this is received "* 1 FETCH (BODY[TEXT] {2021}\r" so parse
     the continuation data contained within the curly brackets */
  while(*ptr && (*ptr != '{'))
    ptr++;

  if(*ptr == '{') {
    char *endptr;
    if(!curlx_strtoofft(ptr + 1, &endptr, 10, &size)) {
      if(endptr - ptr > 1 && endptr[0] == '}' &&
         endptr[1] == '\r' && endptr[2] == '\0')
        parsed = TRUE;
    }
  }

  if(parsed) {
    infof(data, "Found %" CURL_FORMAT_CURL_OFF_T " bytes to download\n",
          size);
    Curl_pgrsSetDownloadSize(data, size);

    if(pp->cache) {
      /* At this point there is a bunch of data in the header "cache" that is
         actually body content, send it as body and then skip it. Do note
         that there may even be additional "headers" after the body. */
      size_t chunk = pp->cache_size;

      if(chunk > (size_t)size)
        /* The conversion from curl_off_t to size_t is always fine here */
        chunk = (size_t)size;

      if(!chunk) {
        /* no size, we're done with the data */
        state(conn, IMAP_STOP);
        return CURLE_OK;
      }
      result = Curl_client_write(conn, CLIENTWRITE_BODY, pp->cache, chunk);
      if(result)
        return result;

      data->req.bytecount += chunk;

      infof(data, "Written %zu bytes, %" CURL_FORMAT_CURL_OFF_TU
            " bytes are left for transfer\n", chunk, size - chunk);

      /* Have we used the entire cache or just part of it?*/
      if(pp->cache_size > chunk) {
        /* Only part of it so shrink the cache to fit the trailing data */
        memmove(pp->cache, pp->cache + chunk, pp->cache_size - chunk);
        pp->cache_size -= chunk;
      }
      else {
        /* Free the cache */
        Curl_safefree(pp->cache);

        /* Reset the cache size */
        pp->cache_size = 0;
      }
    }

    if(data->req.bytecount == size)
      /* The entire data is already transferred! */
      Curl_setup_transfer(conn, -1, -1, FALSE, NULL, -1, NULL);
    else {
      /* IMAP download */
      data->req.maxdownload = size;
      Curl_setup_transfer(conn, FIRSTSOCKET, size, FALSE, NULL, -1, NULL);
    }
  }
  else {
    /* We don't know how to parse this line */
    failf(pp->conn->data, "Failed to parse FETCH response.");
    result = CURLE_WEIRD_SERVER_REPLY;
  }

  /* End of DO phase */
  state(conn, IMAP_STOP);

  return result;
}